

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_12ac559::MemPoolAccept::MemPoolAccept
          (MemPoolAccept *this,CTxMemPool *mempool,Chainstate *active_chainstate)

{
  _Rb_tree_header *p_Var1;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *plVar2;
  long lVar3;
  CCoinsViewCache *baseIn;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_pool = mempool;
  CCoinsViewCache::CCoinsViewCache(&this->m_view,&this->m_dummy,false);
  baseIn = Chainstate::CoinsTip(active_chainstate);
  CCoinsViewMemPool::CCoinsViewMemPool(&this->m_viewmempool,(CCoinsView *)baseIn,this->m_pool);
  (this->m_dummy)._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_00b2a470;
  this->m_active_chainstate = active_chainstate;
  p_Var1 = &(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header;
  (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_subpackage).m_total_modified_fees = 0;
  (this->m_subpackage).m_total_vsize = 0;
  (this->m_subpackage).m_rbf = false;
  (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar2 = &(this->m_subpackage).m_replaced_transactions;
  (this->m_subpackage).m_replaced_transactions.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->m_subpackage).m_replaced_transactions.
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    (this->m_subpackage).m_replaced_transactions.
    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl._M_node._M_size = 0;
    (this->m_subpackage).m_conflicting_fees = 0;
    (this->m_subpackage).m_conflicting_size = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MemPoolAccept(CTxMemPool& mempool, Chainstate& active_chainstate) :
        m_pool(mempool),
        m_view(&m_dummy),
        m_viewmempool(&active_chainstate.CoinsTip(), m_pool),
        m_active_chainstate(active_chainstate)
    {
    }